

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

DynamicType *
Js::PathTypeHandlerBase::CreateNewScopeObject<true>
          (ScriptContext *scriptContext,DynamicType *type,PropertyIdArray *propIds,
          PropertyAttributes extraAttributes,uint extraAttributesSlotCount)

{
  Type propertyId;
  code *pcVar1;
  byte attributes;
  bool bVar2;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *typeHandler;
  PropertyRecord *propertyRecord;
  undefined4 *puVar3;
  Recycler *pRVar4;
  DynamicType *this;
  ulong uVar5;
  undefined1 local_90 [8];
  TrackAllocData data;
  
  data._32_8_ = ZEXT48(propIds->count);
  pRVar4 = scriptContext->recycler;
  typeHandler = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
                New(pRVar4,propIds->count,0,0,true,true);
  for (uVar5 = 0; data._32_8_ != uVar5; uVar5 = uVar5 + 1) {
    propertyId = (&propIds[1].count)[uVar5];
    if (propertyId == 0xffffffff) {
      propertyRecord = (PropertyRecord *)0x0;
    }
    else {
      propertyRecord = ScriptContext::GetPropertyName(scriptContext,propertyId);
    }
    attributes = extraAttributes | 5;
    if (propertyId == 0x1cf) {
      attributes = extraAttributes & 0xbf | 5;
    }
    if (extraAttributesSlotCount <= uVar5) {
      attributes = 5;
    }
    SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *)
               typeHandler,propertyRecord,attributes,scriptContext);
  }
  if (((typeHandler->super_DynamicTypeHandler).flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7c1,"((typeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why does a newly created type handler have the IsPrototypeFlag set?"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  scriptContext->objectLiteralSimpleDictionaryCount =
       scriptContext->objectLiteralSimpleDictionaryCount + 1;
  local_90 = (undefined1  [8])&DynamicType::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9af3a56;
  data.filename._0_4_ = 0x7c7;
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_90);
  this = (DynamicType *)new<Memory::Recycler>(0x38,pRVar4,0x37a1d4);
  DynamicType::DynamicType(this,type,&typeHandler->super_DynamicTypeHandler,true,true);
  return this;
}

Assistant:

DynamicType * PathTypeHandlerBase::CreateNewScopeObject(ScriptContext *scriptContext, DynamicType *type, const PropertyIdArray *propIds, PropertyAttributes extraAttributes, uint extraAttributesSlotCount)
    {
        uint count = propIds->count;

        Recycler* recycler = scriptContext->GetRecycler();

        SimpleDictionaryTypeHandler* typeHandler = SimpleDictionaryTypeHandler::New(recycler, count, 0, 0, true, true);

        for (uint i = 0; i < count; i++)
        {
            PropertyId propertyId = propIds->elements[i];
            const PropertyRecord* propertyRecord = propertyId == Constants::NoProperty ? NULL : scriptContext->GetPropertyName(propertyId);
            // This will add the property as initialized and non-fixed.  That's fine because we will populate the property values on the
            // scope object right after this (see JavascriptOperators::OP_InitCachedScope).  We will not treat these properties as fixed.
            PropertyAttributes attributes = PropertyWritable | PropertyEnumerable;
            if (i < extraAttributesSlotCount)
            {
                attributes |= extraAttributes;
                if (skipLetAttrForArguments && propertyId == PropertyIds::arguments)
                {
                    // Do not add let attribute for built-in arguments symbol
                    attributes &= ~PropertyLet;
                }
            }
            typeHandler->Add(propertyRecord, attributes, scriptContext);
        }
        AssertMsg((typeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why does a newly created type handler have the IsPrototypeFlag set?");

 #ifdef PROFILE_OBJECT_LITERALS
        scriptContext->objectLiteralSimpleDictionaryCount++;
 #endif

        type = RecyclerNew(recycler, DynamicType, type, typeHandler, /* isLocked = */ true, /* isShared = */ true);

        return type;
    }